

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  
  secp256k1_fe_verify(x);
  uVar3 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar12 = (uVar3 >> 0x34) + x->n[1];
  uVar5 = (uVar12 >> 0x34) + x->n[2];
  uVar6 = (uVar5 >> 0x34) + x->n[3];
  uVar7 = (uVar6 >> 0x34) + (x->n[4] & 0xffffffffffff);
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  secp256k1_fe_normalize(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_90.v[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  secp256k1_modinv64(&local_90,&secp256k1_const_modinfo_fe);
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  secp256k1_fe_verify(r);
  puVar11 = (ulong *)(r->n[4] & 0xffffffffffff);
  uVar4 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar2 = (uVar4 >> 0x34) + r->n[1];
  uVar8 = (uVar2 >> 0x34) + r->n[2];
  uVar9 = (uVar8 >> 0x34) + r->n[3];
  puVar10 = (ulong *)((uVar9 >> 0x34) + (long)puVar11);
  if ((((uVar3 ^ 0x1000003d0) & uVar12 & uVar5 & uVar6 & (uVar7 ^ 0xf000000000000)) !=
       0xfffffffffffff && (((uVar12 | uVar3 | uVar5 | uVar6) & 0xfffffffffffff) != 0 || uVar7 != 0))
      != (((uVar4 ^ 0x1000003d0) & uVar2 & uVar8 & uVar9 & ((ulong)puVar10 ^ 0xf000000000000)) ==
          0xfffffffffffff ||
         ((uVar2 | uVar4 | uVar8 | uVar9) & 0xfffffffffffff) == 0 && puVar10 == (ulong *)0x0)) {
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_inv_cold_1();
  uVar2 = *puVar10;
  if (uVar2 >> 0x3e == 0) {
    uVar3 = puVar10[1];
    if (0x3fffffffffffffff < uVar3) goto LAB_001468df;
    uVar4 = puVar10[2];
    if (0x3fffffffffffffff < uVar4) goto LAB_001468e4;
    uVar5 = puVar10[3];
    if (uVar5 < 0x4000000000000000) {
      uVar6 = puVar10[4];
      if (uVar6 < 0x100) {
        *puVar11 = uVar2 & 0xfffffffffffff;
        puVar11[1] = (uVar3 & 0x3ffffffffff) << 10 | uVar2 >> 0x34;
        puVar11[2] = (uVar4 & 0xffffffff) << 0x14 | uVar3 >> 0x2a;
        puVar11[3] = (ulong)((uint)uVar5 & 0x3fffff) << 0x1e | uVar4 >> 0x20;
        puVar11[4] = uVar6 << 0x28 | uVar5 >> 0x16;
        return;
      }
      goto LAB_001468ee;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_001468df:
    secp256k1_fe_from_signed62_cold_4();
LAB_001468e4:
    secp256k1_fe_from_signed62_cold_3();
  }
  secp256k1_fe_from_signed62_cold_2();
LAB_001468ee:
  secp256k1_fe_from_signed62_cold_1();
  uVar1 = *(uint *)((long)puVar10 + 0x1c);
  *puVar11 = (ulong)(*(byte *)((long)puVar10 + 0x19) & 0xf) << 0x30 |
             (ulong)CONCAT15(*(undefined1 *)((long)puVar10 + 0x1a),
                             CONCAT14(*(undefined1 *)((long)puVar10 + 0x1b),
                                      uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                      (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
  puVar11[1] = (ulong)*(byte *)((long)puVar10 + 0x13) << 0x2c |
               (ulong)*(byte *)((long)puVar10 + 0x14) << 0x24 |
               (ulong)*(byte *)((long)puVar10 + 0x15) << 0x1c |
               (ulong)((uint)*(byte *)((long)puVar10 + 0x16) << 0x14 |
                      (uint)*(byte *)((long)puVar10 + 0x17) << 0xc |
                      (uint)(byte)puVar10[3] << 4 | (uint)(*(byte *)((long)puVar10 + 0x19) >> 4));
  uVar1 = *(uint *)((long)puVar10 + 0xf);
  puVar11[2] = (ulong)(*(byte *)((long)puVar10 + 0xc) & 0xf) << 0x30 |
               (ulong)CONCAT15(*(undefined1 *)((long)puVar10 + 0xd),
                               CONCAT14(*(undefined1 *)((long)puVar10 + 0xe),
                                        uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                        (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
  puVar11[3] = (ulong)*(byte *)((long)puVar10 + 6) << 0x2c |
               (ulong)*(byte *)((long)puVar10 + 7) << 0x24 |
               (ulong)(byte)puVar10[1] << 0x1c |
               (ulong)((uint)*(byte *)((long)puVar10 + 9) << 0x14 |
                      (uint)*(byte *)((long)puVar10 + 10) << 0xc |
                      (uint)*(byte *)((long)puVar10 + 0xb) << 4 |
                      (uint)(*(byte *)((long)puVar10 + 0xc) >> 4));
  uVar1 = *(uint *)((long)puVar10 + 2);
  puVar11[4] = (ulong)CONCAT15((char)*puVar10,
                               CONCAT14(*(undefined1 *)((long)puVar10 + 1),
                                        uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                        (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}